

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Pipeline * __thiscall
capnp::anon_unknown_34::BrokenRequest::sendForPipeline
          (Pipeline *__return_storage_ptr__,BrokenRequest *this)

{
  Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t> local_38;
  Own<capnp::PipelineHook,_std::nullptr_t> local_28;
  BrokenRequest *local_18;
  BrokenRequest *this_local;
  
  local_18 = this;
  this_local = (BrokenRequest *)__return_storage_ptr__;
  kj::refcounted<capnp::(anonymous_namespace)::BrokenPipeline,kj::Exception&>
            ((kj *)&local_38,&this->exception);
  kj::Own<capnp::PipelineHook,decltype(nullptr)>::
  Own<capnp::(anonymous_namespace)::BrokenPipeline,void>
            ((Own<capnp::PipelineHook,decltype(nullptr)> *)&local_28,&local_38);
  AnyPointer::Pipeline::Pipeline(__return_storage_ptr__,&local_28);
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::~Own(&local_28);
  kj::Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t>::~Own(&local_38);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline sendForPipeline() override {
    return AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception));
  }